

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O0

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceGaps
          (EdgeTracer *this,PointF dEdge,RegressionLine *line,int maxStepSize,
          RegressionLine *finishLine,double minDist)

{
  PointT<double> d;
  PointT<double> d_00;
  PointI p;
  PointI p_00;
  PointT<double> b;
  PointF p_01;
  PointT<double> p_02;
  PointT<double> b_00;
  PointT<double> p_03;
  PointF p_04;
  PointF p_05;
  PointF p_06;
  PointF p_07;
  PointT<double> d_01;
  PointT<double> a;
  PointF p_08;
  PointT<double> a_00;
  PointF p_09;
  PointF p_10;
  PointF d_02;
  PointT<double> pos;
  PointT<double> pos_00;
  PointT<double> pos_01;
  PointF p_11;
  PointF p_12;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *this_00;
  size_type sVar6;
  const_reference pvVar7;
  long lVar8;
  int *piVar9;
  value_t_conflict2 *pvVar10;
  int in_EDX;
  RegressionLine *in_RSI;
  double in_RDI;
  PointT<double> *a_01;
  undefined8 in_XMM0_Qa;
  double extraout_XMM0_Qa;
  RegressionLine *line_00;
  double dVar11;
  undefined8 in_XMM1_Qa;
  double in_XMM2_Qa;
  StepResult stepResult;
  double stepLengthInMainDir;
  PointT<double> curStep;
  PointF np;
  PointF lastP;
  int maxStepsPerGap;
  int steps;
  int gaps;
  int j;
  PointT<double> pEdge;
  int i;
  int step;
  int breadth;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  int in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  double in_stack_fffffffffffffc18;
  RegressionLine *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  uint in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  undefined8 in_stack_fffffffffffffc38;
  uint in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc44;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  double in_stack_fffffffffffffc50;
  EdgeTracer *in_stack_fffffffffffffc60;
  int local_390;
  undefined8 in_stack_fffffffffffffcb8;
  double in_stack_fffffffffffffcc0;
  RegressionLine *in_stack_fffffffffffffcc8;
  PointT<double> local_2e8;
  RegressionLine *local_2d8;
  PointT<double> local_2d0;
  double local_2c0;
  double local_2b8;
  PointF local_2b0;
  PointT<double> local_2a0;
  double local_290;
  double local_288;
  PointF local_280;
  double local_270;
  double local_268;
  undefined8 local_260;
  undefined8 local_258;
  PointF local_250;
  PointF local_240;
  undefined8 local_230;
  undefined8 local_228;
  PointF local_220;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  double local_1e0;
  undefined8 local_1d8;
  PointT<double> local_1d0;
  PointT<double> local_1c0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  double local_190;
  int local_17c;
  RegressionLine *local_178;
  undefined8 local_168;
  undefined8 local_160;
  bool local_151;
  double local_150;
  double local_148;
  PointT<double> local_140;
  PointT<double> local_130;
  PointT<double> local_120;
  PointT<int> local_110;
  PointT<int> local_108;
  double local_100;
  double local_f8;
  PointF local_f0;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_c0;
  int local_bc;
  PointT<double> local_b8;
  double local_a8;
  double local_a0;
  PointT<double> local_98;
  PointT<double> local_88;
  PointT<double> local_78;
  PointT<double> local_68;
  uint local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 local_40;
  PointT<double> local_38;
  byte local_25;
  int local_24 [3];
  double local_18;
  double local_10;
  int local_4;
  
  d_02.y._0_4_ = in_stack_fffffffffffffc40;
  d_02.x = (double)in_stack_fffffffffffffc38;
  d_02.y._4_4_ = in_stack_fffffffffffffc44;
  local_190 = in_XMM2_Qa;
  local_17c = in_EDX;
  local_178 = in_RSI;
  local_168 = in_XMM0_Qa;
  local_160 = in_XMM1_Qa;
  RegressionLine::setDirectionInward
            ((RegressionLine *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),d_02);
  local_1a4 = 0;
  local_1a8 = 0;
  local_1ac = local_17c;
  PointT<double>::PointT(&local_1c0);
LAB_002771b1:
  local_1d0 = std::exchange<ZXing::PointT<double>,ZXing::PointT<double>&>
                        ((PointT<double> *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         (PointT<double> *)
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  bVar3 = ZXing::operator==((PointT<double> *)((long)in_RDI + 8),&local_1d0);
  bVar4 = true;
  if (!bVar3) {
    if (local_1a4 == 0) {
      local_390 = 2;
    }
    else {
      local_390 = local_1a4 + 1;
    }
    bVar4 = local_390 * local_1ac < local_1a8;
    local_1a8 = local_1a8 + 1;
  }
  if (bVar4) {
    return false;
  }
  local_1e0 = ((PointT<double> *)((long)in_RDI + 8))->x;
  local_1d8 = *(undefined8 *)((long)in_RDI + 0x10);
  log<double>(*(PointT<double> *)((long)in_RDI + 8),0);
  bVar4 = RegressionLine::isValid((RegressionLine *)0x2772b5);
  if (bVar4) {
    local_1f0 = *(undefined8 *)((long)in_RDI + 8);
    local_1e8 = *(undefined8 *)((long)in_RDI + 0x10);
    p_05.x._4_4_ = in_stack_fffffffffffffc2c;
    p_05.x._0_4_ = in_stack_fffffffffffffc28;
    p_05.y._0_4_ = in_stack_fffffffffffffc30;
    p_05.y._4_4_ = in_stack_fffffffffffffc34;
    dVar11 = RegressionLine::signedDistance(in_stack_fffffffffffffc20,p_05);
    if (dVar11 < -5.0) {
      bVar4 = RegressionLine::evaluate
                        (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                         SUB81((ulong)in_stack_fffffffffffffcb8 >> 0x38,0));
      if (!bVar4) {
        return false;
      }
      local_200 = *(undefined8 *)((long)in_RDI + 8);
      local_1f8 = *(undefined8 *)((long)in_RDI + 0x10);
      p_06.x._4_4_ = in_stack_fffffffffffffc2c;
      p_06.x._0_4_ = in_stack_fffffffffffffc28;
      p_06.y._0_4_ = in_stack_fffffffffffffc30;
      p_06.y._4_4_ = in_stack_fffffffffffffc34;
      dVar11 = RegressionLine::signedDistance(in_stack_fffffffffffffc20,p_06);
      if (dVar11 < -5.0) {
        return false;
      }
    }
  }
  bVar4 = RegressionLine::isValid((RegressionLine *)0x277395);
  if (bVar4) {
    local_210 = *(undefined8 *)((long)in_RDI + 8);
    local_208 = *(undefined8 *)((long)in_RDI + 0x10);
    p_07.x._4_4_ = in_stack_fffffffffffffc2c;
    p_07.x._0_4_ = in_stack_fffffffffffffc28;
    p_07.y._0_4_ = in_stack_fffffffffffffc30;
    p_07.y._4_4_ = in_stack_fffffffffffffc34;
    dVar11 = RegressionLine::signedDistance(in_stack_fffffffffffffc20,p_07);
    if (dVar11 <= 3.0) goto LAB_00277684;
    local_230 = *(undefined8 *)((long)in_RDI + 0x18);
    local_228 = *(undefined8 *)((long)in_RDI + 0x20);
    d_01.x._4_4_ = in_stack_fffffffffffffc2c;
    d_01.x._0_4_ = in_stack_fffffffffffffc28;
    d_01.y._0_4_ = in_stack_fffffffffffffc30;
    d_01.y._4_4_ = in_stack_fffffffffffffc34;
    local_220 = normalized<double>(d_01);
    local_240 = RegressionLine::normal
                          ((RegressionLine *)
                           CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    a_01 = &local_220;
    dot<double,double>(a_01,&local_240);
    std::abs((int)a_01);
    if (0.7 < extraout_XMM0_Qa) {
      return false;
    }
    bVar4 = RegressionLine::evaluate
                      (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                       SUB81((ulong)in_stack_fffffffffffffcb8 >> 0x38,0));
    if (!bVar4) {
      return false;
    }
    local_260 = *(undefined8 *)((long)in_RDI + 8);
    local_258 = *(undefined8 *)((long)in_RDI + 0x10);
    p_11.x._4_4_ = in_stack_fffffffffffffc4c;
    p_11.x._0_4_ = in_stack_fffffffffffffc48;
    p_11.y = in_stack_fffffffffffffc50;
    local_250 = RegressionLine::project
                          ((RegressionLine *)
                           CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),p_11);
    while( true ) {
      local_270 = local_250.x;
      local_268 = local_250.y;
      RegressionLine::points(local_178);
      pvVar7 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::back
                         ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
                          CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      local_290 = pvVar7->x;
      local_288 = pvVar7->y;
      p_12.x._4_4_ = in_stack_fffffffffffffc4c;
      p_12.x._0_4_ = in_stack_fffffffffffffc48;
      p_12.y = in_stack_fffffffffffffc50;
      local_280 = RegressionLine::project
                            ((RegressionLine *)
                             CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),p_12);
      a.x._4_4_ = in_stack_fffffffffffffc2c;
      a.x._0_4_ = in_stack_fffffffffffffc28;
      a.y._0_4_ = in_stack_fffffffffffffc30;
      a.y._4_4_ = in_stack_fffffffffffffc34;
      b.y = (double)in_stack_fffffffffffffc20;
      b.x = in_stack_fffffffffffffc18;
      dVar11 = distance<double>(a,b);
      if (1.0 <= dVar11) break;
      local_2a0 = operator+<double,_double>
                            ((PointT<double> *)
                             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                             (PointT<double> *)
                             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      local_250 = local_2a0;
    }
    local_2c0 = local_250.x;
    local_2b8 = local_250.y;
    p_01.y = (double)in_stack_fffffffffffffc20;
    p_01.x = in_stack_fffffffffffffc18;
    local_2b0 = centered(p_01);
    *(double *)((long)in_RDI + 8) = local_2b0.x;
    *(double *)((long)in_RDI + 0x10) = local_2b0.y;
  }
  else {
LAB_00277684:
    RegressionLine::points(local_178);
    bVar4 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::empty
                      (&in_stack_fffffffffffffc20->_points);
    if (bVar4) {
      memset(&local_2d0,0,0x10);
      PointT<double>::PointT(&local_2d0);
    }
    else {
      in_stack_fffffffffffffc60 = (EdgeTracer *)((long)in_RDI + 8);
      RegressionLine::points(local_178);
      std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::back
                ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      local_2d0 = operator-<double,_double>
                            ((PointT<double> *)
                             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                             (PointT<double> *)
                             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    }
    RegressionLine::points(local_178);
    bVar4 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::empty
                      (&in_stack_fffffffffffffc20->_points);
    if (bVar4) {
      line_00 = (RegressionLine *)0x0;
    }
    else {
      d.x._4_4_ = in_stack_fffffffffffffc0c;
      d.x._0_4_ = in_stack_fffffffffffffc08;
      d.y._0_4_ = in_stack_fffffffffffffc10;
      d.y._4_4_ = in_stack_fffffffffffffc14;
      local_2e8 = mainDirection<double>(d);
      line_00 = (RegressionLine *)dot<double,double>(&local_2e8,&local_2d0);
    }
    p_08.x._4_4_ = in_stack_fffffffffffffc2c;
    p_08.x._0_4_ = in_stack_fffffffffffffc28;
    p_08.y._0_4_ = in_stack_fffffffffffffc30;
    p_08.y._4_4_ = in_stack_fffffffffffffc34;
    local_2d8 = line_00;
    RegressionLine::add(in_stack_fffffffffffffc20,p_08);
    if ((1.0 < (double)local_2d8) ||
       (p_02.y = (double)in_stack_fffffffffffffc20, p_02.x = in_stack_fffffffffffffc18,
       dVar11 = maxAbsComponent<double>(p_02), 2.0 <= dVar11)) {
      local_1a4 = local_1a4 + 1;
      if (local_1a4 < 2) {
        this_00 = RegressionLine::points(local_178);
        sVar6 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::size
                          (this_00);
        if (sVar6 < 6) goto LAB_002779b2;
      }
      bVar4 = updateDirectionFromLine(in_stack_fffffffffffffc60,line_00);
      if (!bVar4) {
        return false;
      }
      if (((local_190 != 0.0) || (NAN(local_190))) && (3 < local_1a4)) {
        RegressionLine::points(local_178);
        pvVar7 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::front
                           ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        in_stack_fffffffffffffcc8 = (RegressionLine *)pvVar7->x;
        a_00.x._4_4_ = in_stack_fffffffffffffc2c;
        a_00.x._0_4_ = in_stack_fffffffffffffc28;
        a_00.y._0_4_ = in_stack_fffffffffffffc30;
        a_00.y._4_4_ = in_stack_fffffffffffffc34;
        b_00.y = (double)in_stack_fffffffffffffc20;
        b_00.x = in_stack_fffffffffffffc18;
        dVar11 = distance<double>(a_00,b_00);
        if (local_190 < dVar11) {
          RegressionLine::pop_back((RegressionLine *)0x277953);
          return true;
        }
      }
    }
    else if (local_1a4 == 0) {
      RegressionLine::points(local_178);
      iVar5 = Size<std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>>
                        ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      if (SBORROW4(iVar5,local_17c * 2) == iVar5 + local_17c * -2 < 0) {
        return false;
      }
    }
  }
LAB_002779b2:
  bVar4 = RegressionLine::isValid((RegressionLine *)0x2779bf);
  if (bVar4) {
    in_stack_fffffffffffffcb8 = *(undefined8 *)((long)in_RDI + 8);
    in_stack_fffffffffffffcc0 = *(double *)((long)in_RDI + 0x10);
    p_09.x._4_4_ = in_stack_fffffffffffffc2c;
    p_09.x._0_4_ = in_stack_fffffffffffffc28;
    p_09.y._0_4_ = in_stack_fffffffffffffc30;
    p_09.y._4_4_ = in_stack_fffffffffffffc34;
    RegressionLine::signedDistance(in_stack_fffffffffffffc20,p_09);
    UpdateMin<int>((int *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   in_stack_fffffffffffffc0c);
  }
  uVar2 = local_160;
  uVar1 = local_168;
  in_stack_fffffffffffffc4c = local_17c;
  local_25 = RegressionLine::isValid((RegressionLine *)0x277a4d);
  local_18 = (double)uVar1;
  local_10 = (double)uVar2;
  local_48 = uVar1;
  local_40 = uVar2;
  d_00.x._4_4_ = in_stack_fffffffffffffc0c;
  d_00.x._0_4_ = in_stack_fffffffffffffc08;
  d_00.y._0_4_ = in_stack_fffffffffffffc10;
  d_00.y._4_4_ = in_stack_fffffffffffffc14;
  in_stack_fffffffffffffc50 = in_RDI;
  local_24[0] = in_stack_fffffffffffffc4c;
  local_38 = mainDirection<double>(d_00);
  local_18 = local_38.x;
  local_10 = local_38.y;
  local_4c = 1;
  while( true ) {
    if (local_24[0] == 1) {
      in_stack_fffffffffffffc44 = 2;
    }
    else {
      in_stack_fffffffffffffc44 = 3;
      if ((local_25 & 1) != 0) {
        in_stack_fffffffffffffc44 = 1;
      }
    }
    in_stack_fffffffffffffc48 = local_4c;
    if (in_stack_fffffffffffffc44 < local_4c) break;
    for (local_50 = 1; local_50 <= local_24[0]; local_50 = local_50 + 1) {
      for (local_54 = 0; in_stack_fffffffffffffc40 = local_54,
          (int)local_54 <= (local_50 / 4 + 1) * 2 * local_4c; local_54 = local_54 + 1) {
        lVar8 = (long)in_stack_fffffffffffffc50 + 8;
        local_88 = ZXing::operator*(in_stack_fffffffffffffc14,
                                    (PointT<double> *)
                                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        local_78 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                              (PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        if ((local_54 & 1) == 0) {
          iVar5 = -local_54;
        }
        else {
          iVar5 = local_54 + 1;
        }
        in_stack_fffffffffffffc34 = iVar5 / 2;
        local_98 = ZXing::operator*(in_stack_fffffffffffffc14,
                                    (PointT<double> *)
                                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        local_68 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                              (PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        local_a8 = local_68.x;
        local_a0 = local_68.y;
        log<double>(local_68,0);
        local_b8 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                              (PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        pos.y._0_4_ = in_stack_fffffffffffffc40;
        pos.x = (double)lVar8;
        pos.y._4_4_ = in_stack_fffffffffffffc44;
        bVar4 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt
                          ((BitMatrixCursor<ZXing::PointT<double>_> *)
                           CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),pos);
        if (bVar4) {
          local_bc = 0;
          goto LAB_00277d3e;
        }
      }
    }
    local_4c = local_4c + 1;
  }
  local_4 = 1;
  goto LAB_00278091;
LAB_00277d3e:
  local_c0 = 3;
  in_stack_fffffffffffffc2c = local_bc;
  piVar9 = std::max<int>(local_24,&local_c0);
  in_stack_fffffffffffffc30 = in_stack_fffffffffffffc30 & 0xffffff;
  if (in_stack_fffffffffffffc2c < *piVar9) {
    local_d0 = local_68.x;
    local_c8 = local_68.y;
    p_03.y = (double)in_stack_fffffffffffffc20;
    p_03.x = in_stack_fffffffffffffc18;
    bVar4 = BitMatrixCursor<ZXing::PointT<double>_>::isIn
                      ((BitMatrixCursor<ZXing::PointT<double>_> *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),p_03);
    in_stack_fffffffffffffc30 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffc30);
  }
  if ((char)(in_stack_fffffffffffffc30 >> 0x18) == '\0') {
    local_4 = 2;
    goto LAB_00278091;
  }
  local_e0 = local_68.x;
  local_d8 = local_68.y;
  pos_00.y._0_4_ = in_stack_fffffffffffffc40;
  pos_00.x = (double)lVar8;
  pos_00.y._4_4_ = in_stack_fffffffffffffc44;
  bVar4 = BitMatrixCursor<ZXing::PointT<double>_>::whiteAt
                    ((BitMatrixCursor<ZXing::PointT<double>_> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),pos_00);
  if (bVar4) goto LAB_00277e0c;
  local_120 = operator-<double,_double>
                        ((PointT<double> *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         (PointT<double> *)
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  local_68 = local_120;
  local_130 = operator-<double,_double>
                        ((PointT<double> *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         (PointT<double> *)
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  pos_01.y._0_4_ = in_stack_fffffffffffffc40;
  pos_01.x = (double)lVar8;
  pos_01.y._4_4_ = in_stack_fffffffffffffc44;
  bVar4 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt
                    ((BitMatrixCursor<ZXing::PointT<double>_> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),pos_01);
  if (bVar4) {
    local_140 = operator-<double,_double>
                          ((PointT<double> *)
                           CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                           (PointT<double> *)
                           CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    local_68 = local_140;
  }
  local_150 = local_68.x;
  local_148 = local_68.y;
  log<double>(local_68,0);
  local_bc = local_bc + 1;
  goto LAB_00277d3e;
LAB_00277e0c:
  local_100 = local_68.x;
  local_f8 = local_68.y;
  p_04.y = (double)in_stack_fffffffffffffc20;
  p_04.x = in_stack_fffffffffffffc18;
  local_f0 = centered(p_04);
  *(double *)((long)in_stack_fffffffffffffc50 + 8) = local_f0.x;
  *(double *)((long)in_stack_fffffffffffffc50 + 0x10) = local_f0.y;
  if ((*(long *)((long)in_stack_fffffffffffffc50 + 0x28) != 0) && (local_24[0] == 1)) {
    in_stack_fffffffffffffc20 = *(RegressionLine **)((long)in_stack_fffffffffffffc50 + 0x28);
    PointT<int>::PointT<double>(&local_108,(PointT<double> *)((long)in_stack_fffffffffffffc50 + 8));
    p.y = in_stack_fffffffffffffc14;
    p.x = in_stack_fffffffffffffc10;
    pvVar10 = Matrix<signed_char>::get
                        ((Matrix<signed_char> *)
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),p);
    if ((int)*pvVar10 == *(int *)((long)in_stack_fffffffffffffc50 + 0x30)) {
      local_4 = 2;
      goto LAB_00278091;
    }
    in_stack_fffffffffffffc18 = *(double *)((long)in_stack_fffffffffffffc50 + 0x28);
    PointT<int>::PointT<double>(&local_110,(PointT<double> *)((long)in_stack_fffffffffffffc50 + 8));
    p_00.y = in_stack_fffffffffffffc14;
    p_00.x = in_stack_fffffffffffffc10;
    Matrix<signed_char>::set
              ((Matrix<signed_char> *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               p_00,'\0');
  }
  local_4 = 0;
LAB_00278091:
  if (local_4 != 0) {
    local_151 = false;
    if (local_4 == 1) {
      bVar4 = RegressionLine::isValid((RegressionLine *)0x2780ca);
      local_151 = false;
      if (bVar4) {
        p_10.x._4_4_ = in_stack_fffffffffffffc2c;
        p_10.x._0_4_ = in_stack_fffffffffffffc28;
        p_10.y._0_4_ = in_stack_fffffffffffffc30;
        p_10.y._4_4_ = in_stack_fffffffffffffc34;
        dVar11 = RegressionLine::signedDistance(in_stack_fffffffffffffc20,p_10);
        local_151 = (int)dVar11 <= local_17c + 1;
      }
    }
    return local_151;
  }
  goto LAB_002771b1;
}

Assistant:

bool traceGaps(PointF dEdge, RegressionLine& line, int maxStepSize, const RegressionLine& finishLine = {}, double minDist = 0)
	{
		line.setDirectionInward(dEdge);
		int gaps = 0, steps = 0, maxStepsPerGap = maxStepSize;
		PointF lastP;
		do {
			// detect an endless loop (lack of progress). if encountered, please report.
			// this fixes a deadlock in falsepositives-1/#570.png and the regression in #574
			if (p == std::exchange(lastP, p) || steps++ > (gaps == 0 ? 2 : gaps + 1) * maxStepsPerGap)
				return false;
			log(p);

			// if we drifted too far outside of the code, break
			if (line.isValid() && line.signedDistance(p) < -5 && (!line.evaluate() || line.signedDistance(p) < -5))
				return false;

			// if we are drifting towards the inside of the code, pull the current position back out onto the line
			if (line.isValid() && line.signedDistance(p) > 3) {
				// The current direction d and the line we are tracing are supposed to be roughly parallel.
				// In case the 'go outward' step in traceStep lead us astray, we might end up with a line
				// that is almost perpendicular to d. Then the back-projection below can result in an
				// endless loop. Break if the angle between d and line is greater than 45 deg.
				if (std::abs(dot(normalized(d), line.normal())) > 0.7) // thresh is approx. sin(45 deg)
					return false;

				// re-evaluate line with all the points up to here before projecting
				if (!line.evaluate(1.5))
					return false;

				auto np = line.project(p);
				// make sure we are making progress even when back-projecting:
				// consider a 90deg corner, rotated 45deg. we step away perpendicular from the line and get
				// back projected where we left off the line.
				// The 'while' instead of 'if' was introduced to fix the issue with #245. It turns out that
				// np can actually be behind the projection of the last line point and we need 2 steps in d
				// to prevent a dead lock. see #245.png
				while (distance(np, line.project(line.points().back())) < 1)
					np = np + d;
				p = centered(np);
			}
			else {
				auto curStep = line.points().empty() ? PointF() : p - line.points().back();
				auto stepLengthInMainDir = line.points().empty() ? 0.0 : dot(mainDirection(d), curStep);
				line.add(p);

				if (stepLengthInMainDir > 1 || maxAbsComponent(curStep) >= 2) {
					++gaps;
					if (gaps >= 2 || line.points().size() > 5) {
						if (!updateDirectionFromLine(line))
							return false;
						// check if the first half of the top-line trace is complete.
						// the minimum code size is 10x10 -> every code has at least 4 gaps
						if (minDist && gaps >= 4 && distance(p, line.points().front()) > minDist) {
							// undo the last insert, it will be inserted again after the restart
							line.pop_back();
							--gaps;
							return true;
						}
					}
				} else if (gaps == 0 && Size(line.points()) >= 2 * maxStepSize) {
					return false; // no point in following a line that has no gaps
				}
			}

			if (finishLine.isValid())
				UpdateMin(maxStepSize, static_cast<int>(finishLine.signedDistance(p)));

			auto stepResult = traceStep(dEdge, maxStepSize, line.isValid());

			if (stepResult != StepResult::FOUND)
				// we are successful iff we found an open end across a valid finishLine
				return stepResult == StepResult::OPEN_END && finishLine.isValid() &&
					   static_cast<int>(finishLine.signedDistance(p)) <= maxStepSize + 1;
		} while (true);
	}